

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.h
# Opt level: O0

bool __thiscall Kumu::ByteString::Unarchive(ByteString *this,MemIOReader *Reader)

{
  bool bVar1;
  int iVar2;
  Result_t local_90;
  ui32_t local_24;
  MemIOReader *pMStack_20;
  ui32_t tmp_len;
  MemIOReader *Reader_local;
  ByteString *this_local;
  
  pMStack_20 = Reader;
  Reader_local = (MemIOReader *)this;
  if (Reader != (MemIOReader *)0x0) {
    bVar1 = MemIOReader::ReadUi32BE(Reader,&local_24);
    if (bVar1) {
      Capacity(&local_90,this,local_24);
      iVar2 = Result_t::operator_cast_to_int(&local_90);
      Result_t::~Result_t(&local_90);
      if (iVar2 < 0) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = MemIOReader::ReadRaw(pMStack_20,this->m_Data,local_24);
        if (bVar1) {
          this->m_Length = local_24;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("Reader",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                ,0x23d,"virtual bool Kumu::ByteString::Unarchive(MemIOReader *)");
}

Assistant:

inline virtual bool Unarchive(MemIOReader* Reader) {
	assert(Reader);
	ui32_t tmp_len;
	if ( ! Reader->ReadUi32BE(&tmp_len) ) return false;
	if ( KM_FAILURE(Capacity(tmp_len)) ) return false;
	if ( ! Reader->ReadRaw(m_Data, tmp_len) ) return false;
	m_Length = tmp_len;
	return true;
      }